

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_dist.cpp
# Opt level: O1

Read<int> __thiscall Omega_h::Dist::exch<int>(Dist *this,Read<int> *data,Int width)

{
  Library *pLVar1;
  void **ppvVar2;
  int *piVar3;
  void *pvVar4;
  Alloc *pAVar5;
  element_type *peVar6;
  Dist *pDVar7;
  long *plVar8;
  Int in_ECX;
  pointer pbVar9;
  undefined4 in_register_00000014;
  ulong *puVar10;
  void *extraout_RDX;
  element_type *peVar11;
  Read<int> RVar12;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer exch_timer;
  string __str;
  ScopedTimer local_159;
  undefined1 local_158 [24];
  Alloc *pAStack_140;
  pointer local_138;
  Alloc *local_130;
  undefined1 local_128 [16];
  LOs local_118;
  Read<int> local_108;
  Read<int> local_f8;
  Read<int> local_e8;
  Read<int> local_d8;
  element_type **local_c8;
  long local_c0;
  element_type *local_b8 [2];
  Read<int> local_a8;
  Alloc *local_98;
  void *local_90;
  LOs local_88;
  LOs local_78;
  Dist *local_68;
  Write<int> local_60;
  long *local_50 [2];
  long local_40 [2];
  
  puVar10 = (ulong *)CONCAT44(in_register_00000014,width);
  local_68 = this;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_dist.cpp"
             ,"");
  plVar8 = (long *)std::__cxx11::string::append((char *)local_50);
  pbVar9 = (pointer)(plVar8 + 2);
  if ((pointer)*plVar8 == pbVar9) {
    local_128._0_8_ = (pbVar9->_M_dataplus)._M_p;
    local_128._8_8_ = plVar8[3];
    local_138 = (pointer)local_128;
  }
  else {
    local_128._0_8_ = (pbVar9->_M_dataplus)._M_p;
    local_138 = (pointer)*plVar8;
  }
  local_130 = (Alloc *)plVar8[1];
  *plVar8 = (long)pbVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct((ulong)&local_c8,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_c8,3,0x6e);
  peVar6 = (element_type *)((long)&local_130->size + local_c0);
  peVar11 = (element_type *)0xf;
  if (local_138 != (pointer)local_128) {
    peVar11 = (element_type *)local_128._0_8_;
  }
  if (peVar11 < peVar6) {
    peVar11 = (element_type *)0xf;
    if (local_c8 != local_b8) {
      peVar11 = local_b8[0];
    }
    if (peVar6 <= peVar11) {
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_c8,0,(char *)0x0,(ulong)local_138);
      goto LAB_00298223;
    }
  }
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_c8);
LAB_00298223:
  local_158._0_8_ = local_158 + 0x10;
  pLVar1 = (Library *)(plVar8 + 2);
  if ((Library *)*plVar8 == pLVar1) {
    local_158._16_8_ = *(undefined8 *)pLVar1;
    pAStack_140 = (Alloc *)plVar8[3];
  }
  else {
    local_158._16_8_ = *(undefined8 *)pLVar1;
    local_158._0_8_ = (Library *)*plVar8;
  }
  local_158._8_8_ = plVar8[1];
  *plVar8 = (long)pLVar1;
  plVar8[1] = 0;
  *(undefined1 *)&pLVar1->self_send_threshold_ = 0;
  begin_code("exch",(char *)local_158._0_8_);
  if ((Library *)local_158._0_8_ != (Library *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,(ulong)((long)&local_b8[0]->library_ + 1));
  }
  if (local_138 != (pointer)local_128) {
    operator_delete(local_138,(ulong)((long)(Library **)local_128._0_8_ + 1));
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  begin_code("Dist::exch",(char *)0x0);
  pvVar4 = data[1].write_.shared_alloc_.direct_ptr;
  if (pvVar4 != (void *)0x0) {
    local_d8.write_.shared_alloc_.alloc = (Alloc *)*puVar10;
    if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d8.write_.shared_alloc_.alloc =
             (Alloc *)((local_d8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_d8.write_.shared_alloc_.alloc)->use_count =
             (local_d8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_d8.write_.shared_alloc_.direct_ptr = (void *)puVar10[1];
    local_78.write_.shared_alloc_.alloc = data[1].write_.shared_alloc_.alloc;
    if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
        local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78.write_.shared_alloc_.alloc =
             (Alloc *)((local_78.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_78.write_.shared_alloc_.alloc)->use_count =
             (local_78.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_78.write_.shared_alloc_.direct_ptr = pvVar4;
    expand<int>((Omega_h *)local_158,&local_d8,&local_78,in_ECX);
    pAVar5 = (Alloc *)*puVar10;
    if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
      piVar3 = &pAVar5->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(pAVar5);
        operator_delete(pAVar5,0x48);
      }
    }
    *puVar10 = local_158._0_8_;
    puVar10[1] = local_158._8_8_;
    if (((local_158._0_8_ & 7) == 0 && (Library *)local_158._0_8_ != (Library *)0x0) &&
       (entering_parallel == '\x01')) {
      *(int *)&(((CommPtr *)(local_158._0_8_ + 0x30))->
               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(int *)&(((CommPtr *)(local_158._0_8_ + 0x30))->
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + -1;
      *puVar10 = *(long *)local_158._0_8_ * 8 + 1;
    }
    pAVar5 = local_78.write_.shared_alloc_.alloc;
    local_158._0_8_ = (Library *)0x0;
    local_158._8_8_ = (Alloc *)0x0;
    if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
        local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar3 = &(local_78.write_.shared_alloc_.alloc)->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(local_78.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    pAVar5 = local_d8.write_.shared_alloc_.alloc;
    if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar3 = &(local_d8.write_.shared_alloc_.alloc)->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(local_d8.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
  }
  pvVar4 = data[3].write_.shared_alloc_.direct_ptr;
  if (pvVar4 != (void *)0x0) {
    local_e8.write_.shared_alloc_.alloc = (Alloc *)*puVar10;
    if (((ulong)local_e8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_e8.write_.shared_alloc_.alloc =
             (Alloc *)((local_e8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_e8.write_.shared_alloc_.alloc)->use_count =
             (local_e8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_e8.write_.shared_alloc_.direct_ptr = (void *)puVar10[1];
    local_88.write_.shared_alloc_.alloc = data[3].write_.shared_alloc_.alloc;
    if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
        local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_88.write_.shared_alloc_.alloc =
             (Alloc *)((local_88.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_88.write_.shared_alloc_.alloc)->use_count =
             (local_88.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_88.write_.shared_alloc_.direct_ptr = pvVar4;
    permute<int>((Omega_h *)local_158,&local_e8,&local_88,in_ECX);
    pAVar5 = (Alloc *)*puVar10;
    if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
      piVar3 = &pAVar5->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(pAVar5);
        operator_delete(pAVar5,0x48);
      }
    }
    *puVar10 = local_158._0_8_;
    puVar10[1] = local_158._8_8_;
    if (((local_158._0_8_ & 7) == 0 && (Library *)local_158._0_8_ != (Library *)0x0) &&
       (entering_parallel == '\x01')) {
      *(int *)&(((CommPtr *)(local_158._0_8_ + 0x30))->
               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(int *)&(((CommPtr *)(local_158._0_8_ + 0x30))->
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + -1;
      *puVar10 = *(long *)local_158._0_8_ * 8 + 1;
    }
    pAVar5 = local_88.write_.shared_alloc_.alloc;
    local_158._0_8_ = (Library *)0x0;
    local_158._8_8_ = (Alloc *)0x0;
    if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
        local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar3 = &(local_88.write_.shared_alloc_.alloc)->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    pAVar5 = local_e8.write_.shared_alloc_.alloc;
    if (((ulong)local_e8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar3 = &(local_e8.write_.shared_alloc_.alloc)->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(local_e8.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
  }
  pAVar5 = data[7].write_.shared_alloc_.alloc;
  local_f8.write_.shared_alloc_.alloc = (Alloc *)*puVar10;
  if (((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.write_.shared_alloc_.alloc =
           (Alloc *)((local_f8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_f8.write_.shared_alloc_.alloc)->use_count =
           (local_f8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_f8.write_.shared_alloc_.direct_ptr = (void *)puVar10[1];
  local_108.write_.shared_alloc_.alloc = data[5].write_.shared_alloc_.alloc;
  if (((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
      local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108.write_.shared_alloc_.alloc =
           (Alloc *)((local_108.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_108.write_.shared_alloc_.alloc)->use_count =
           (local_108.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_108.write_.shared_alloc_.direct_ptr = data[5].write_.shared_alloc_.direct_ptr;
  local_98 = data[6].write_.shared_alloc_.alloc;
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98 = (Alloc *)(local_98->size * 8 + 1);
    }
    else {
      local_98->use_count = local_98->use_count + 1;
    }
  }
  local_90 = data[6].write_.shared_alloc_.direct_ptr;
  Comm::alltoallv<int>((Comm *)local_158,(Read<int> *)pAVar5,&local_f8,&local_108,(Int)&local_98);
  pAVar5 = (Alloc *)*puVar10;
  if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
    piVar3 = &pAVar5->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(pAVar5);
      operator_delete(pAVar5,0x48);
    }
  }
  *puVar10 = local_158._0_8_;
  puVar10[1] = local_158._8_8_;
  if (((local_158._0_8_ & 7) == 0 && (Library *)local_158._0_8_ != (Library *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)&(((CommPtr *)(local_158._0_8_ + 0x30))->
             super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(int *)&(((CommPtr *)(local_158._0_8_ + 0x30))->
                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + -1;
    *puVar10 = *(long *)local_158._0_8_ * 8 + 1;
  }
  pAVar5 = local_98;
  local_158._0_8_ = (Library *)0x0;
  local_158._8_8_ = (Alloc *)0x0;
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    piVar3 = &local_98->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_98);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_108.write_.shared_alloc_.alloc;
  if (((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
      local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_108.write_.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_108.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  pAVar5 = local_f8.write_.shared_alloc_.alloc;
  if (((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_f8.write_.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_f8.write_.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  pvVar4 = data[4].write_.shared_alloc_.direct_ptr;
  if (pvVar4 != (void *)0x0) {
    local_118.write_.shared_alloc_.alloc = data[4].write_.shared_alloc_.alloc;
    if (((ulong)local_118.write_.shared_alloc_.alloc & 7) == 0 &&
        local_118.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_118.write_.shared_alloc_.alloc =
             (Alloc *)((local_118.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_118.write_.shared_alloc_.alloc)->use_count =
             (local_118.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_a8.write_.shared_alloc_.alloc = (Alloc *)*puVar10;
    if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_a8.write_.shared_alloc_.alloc =
             (Alloc *)((local_a8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_a8.write_.shared_alloc_.alloc)->use_count =
             (local_a8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_a8.write_.shared_alloc_.direct_ptr = (void *)puVar10[1];
    local_118.write_.shared_alloc_.direct_ptr = pvVar4;
    unmap<int>((Omega_h *)&local_60,&local_118,&local_a8,in_ECX);
    Read<int>::Read((Read<signed_char> *)local_158,&local_60);
    pAVar5 = (Alloc *)*puVar10;
    if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
      piVar3 = &pAVar5->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(pAVar5);
        operator_delete(pAVar5,0x48);
      }
    }
    *puVar10 = local_158._0_8_;
    puVar10[1] = local_158._8_8_;
    if (((local_158._0_8_ & 7) == 0 && (Library *)local_158._0_8_ != (Library *)0x0) &&
       (entering_parallel == '\x01')) {
      *(int *)&(((CommPtr *)(local_158._0_8_ + 0x30))->
               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(int *)&(((CommPtr *)(local_158._0_8_ + 0x30))->
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + -1;
      *puVar10 = *(long *)local_158._0_8_ * 8 + 1;
    }
    local_158._0_8_ = (Library *)0x0;
    local_158._8_8_ = (Alloc *)0x0;
    if (((ulong)local_60.shared_alloc_.alloc & 7) == 0 &&
        local_60.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar3 = &(local_60.shared_alloc_.alloc)->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(local_60.shared_alloc_.alloc);
        operator_delete(local_60.shared_alloc_.alloc,0x48);
      }
    }
    pAVar5 = local_a8.write_.shared_alloc_.alloc;
    if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar3 = &(local_a8.write_.shared_alloc_.alloc)->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(local_a8.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    pAVar5 = local_118.write_.shared_alloc_.alloc;
    if (((ulong)local_118.write_.shared_alloc_.alloc & 7) == 0 &&
        local_118.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar3 = &(local_118.write_.shared_alloc_.alloc)->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(local_118.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
  }
  pDVar7 = local_68;
  peVar6 = (element_type *)*puVar10;
  (local_68->parent_comm_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar6;
  (local_68->parent_comm_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar10[1];
  if ((((ulong)peVar6 & 7) == 0 && peVar6 != (element_type *)0x0) && (entering_parallel == '\x01'))
  {
    ppvVar2 = (void **)((long)&(peVar6->host_srcs_).read_.write_.shared_alloc_ + 8);
    *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
    (local_68->parent_comm_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)((long)peVar6->library_ * 8 + 1);
  }
  *puVar10 = 0;
  puVar10[1] = 0;
  ScopedTimer::~ScopedTimer((ScopedTimer *)&local_138);
  ScopedTimer::~ScopedTimer(&local_159);
  RVar12.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar12.write_.shared_alloc_.alloc = (Alloc *)pDVar7;
  return (Read<int>)RVar12.write_.shared_alloc_;
}

Assistant:

Read<T> Dist::exch(Read<T> data, Int width) const {
  OMEGA_H_TIME_FUNCTION;
  ScopedTimer exch_timer("Dist::exch");
  if (roots2items_[F].exists()) {
    data = expand(data, roots2items_[F], width);
  }
  if (items2content_[F].exists()) {
    data = permute(data, items2content_[F], width);
  }
  data = comm_[F]->alltoallv(data, msgs2content_[F], msgs2content_[R], width);
  if (items2content_[R].exists()) {
    data = unmap(items2content_[R], data, width);
  }
  return data;
}